

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O1

int stbi__create_png_image_raw
              (stbi__png *a,stbi_uc *raw,stbi__uint32 raw_len,int out_n,stbi__uint32 x,
              stbi__uint32 y,int depth,int color)

{
  ushort *puVar1;
  int a_00;
  byte bVar2;
  byte bVar3;
  uint uVar4;
  uint uVar5;
  int iVar6;
  int iVar7;
  stbi_uc *psVar8;
  uint uVar9;
  uint uVar10;
  stbi_uc *psVar11;
  byte bVar12;
  uint uVar13;
  uint uVar14;
  int iVar15;
  uint uVar16;
  int iVar17;
  long lVar18;
  int iVar19;
  long lVar20;
  uint uVar21;
  ulong uVar23;
  long lVar24;
  stbi_uc *psVar25;
  byte *pbVar26;
  uint uVar27;
  long lVar28;
  stbi_uc *psVar29;
  byte *pbVar30;
  long lVar31;
  long lVar32;
  ulong uVar33;
  bool bVar34;
  ulong local_c0;
  ulong local_70;
  ulong uVar22;
  
  bVar34 = depth == 0x10;
  uVar4 = x * out_n;
  uVar5 = uVar4 << bVar34;
  a_00 = a->s->img_n;
  lVar31 = (long)a_00;
  uVar33 = (ulong)(uint)(a_00 << bVar34);
  psVar8 = (stbi_uc *)stbi__malloc_mad3(x,y,out_n << bVar34,0);
  a->out = psVar8;
  if (psVar8 == (stbi_uc *)0x0) {
    stbi__g_failure_reason = "outofmem";
  }
  else {
    iVar6 = stbi__mad3sizes_valid(a_00,x,depth,7);
    if (iVar6 == 0) {
      stbi__g_failure_reason = "too large";
    }
    else {
      iVar6 = a_00 * x;
      uVar21 = iVar6 * depth + 7U >> 3;
      uVar22 = (ulong)uVar21;
      if ((uVar21 + 1) * y <= raw_len) {
        if (y != 0) {
          lVar32 = -(ulong)uVar5;
          lVar28 = (long)(out_n << bVar34);
          iVar7 = x - 1;
          lVar18 = -lVar28;
          uVar10 = 0;
          local_c0 = 0;
          local_70 = (ulong)x;
          do {
            pbVar30 = raw + 1;
            bVar2 = *raw;
            if ((ulong)bVar2 < 5) {
              psVar8 = a->out + uVar5 * (int)local_c0;
              if (depth < 8) {
                if (x < uVar21) {
                  stbi__g_failure_reason = "invalid width";
                  bVar34 = false;
                  goto LAB_00152da7;
                }
                psVar8 = psVar8 + (uVar4 - uVar21);
                uVar33 = 1;
                local_70 = uVar22;
              }
              if (local_c0 == 0) {
                bVar2 = ""[bVar2];
              }
              iVar15 = (int)uVar33;
              if (0 < iVar15) {
                uVar23 = 0;
                do {
                  switch(bVar2) {
                  case 0:
                  case 1:
                  case 5:
                  case 6:
                    bVar3 = pbVar30[uVar23];
                    goto LAB_0015285e;
                  case 2:
                  case 4:
                    bVar3 = psVar8[uVar23 + lVar32];
                    break;
                  case 3:
                    bVar3 = psVar8[uVar23 + lVar32] >> 1;
                    break;
                  default:
                    goto switchD_00152844_default;
                  }
                  bVar3 = bVar3 + pbVar30[uVar23];
LAB_0015285e:
                  psVar8[uVar23] = bVar3;
switchD_00152844_default:
                  uVar23 = uVar23 + 1;
                } while (uVar33 != uVar23);
              }
              if (depth == 8) {
                lVar24 = (long)out_n;
                lVar20 = lVar31;
                if (a_00 != out_n) {
                  psVar8[lVar31] = 0xff;
                }
LAB_001528ab:
                pbVar30 = pbVar30 + lVar20;
              }
              else {
                if (depth == 0x10) {
                  lVar20 = (long)iVar15;
                  lVar24 = lVar28;
                  if (a_00 != out_n) {
                    (psVar8 + lVar20)[0] = 0xff;
                    (psVar8 + lVar20)[1] = 0xff;
                  }
                  goto LAB_001528ab;
                }
                pbVar30 = raw + 2;
                lVar24 = 1;
              }
              psVar29 = psVar8 + lVar24;
              if (a_00 == out_n || depth < 8) {
                uVar9 = ((int)local_70 + -1) * iVar15;
                switch(bVar2) {
                case 0:
                  memcpy(psVar29,pbVar30,(long)(int)uVar9);
                  break;
                case 1:
                  if (0 < (int)uVar9) {
                    uVar23 = 0;
                    do {
                      psVar29[uVar23] = psVar8[uVar23 + (lVar24 - iVar15)] + pbVar30[uVar23];
                      uVar23 = uVar23 + 1;
                    } while (uVar9 != uVar23);
                  }
                  break;
                case 2:
                  if (0 < (int)uVar9) {
                    uVar23 = 0;
                    do {
                      psVar29[uVar23] = psVar29[uVar23 + lVar32] + pbVar30[uVar23];
                      uVar23 = uVar23 + 1;
                    } while (uVar9 != uVar23);
                  }
                  break;
                case 3:
                  if (0 < (int)uVar9) {
                    uVar23 = 0;
                    do {
                      psVar29[uVar23] =
                           (char)((uint)psVar8[uVar23 + (lVar24 - iVar15)] +
                                  (uint)psVar29[uVar23 + lVar32] >> 1) + pbVar30[uVar23];
                      uVar23 = uVar23 + 1;
                    } while (uVar9 != uVar23);
                  }
                  break;
                case 4:
                  if (0 < (int)uVar9) {
                    pbVar26 = psVar8 + (lVar24 - iVar15);
                    uVar23 = 0;
                    do {
                      bVar2 = *pbVar26;
                      bVar3 = psVar29[lVar32];
                      bVar12 = pbVar26[lVar32];
                      iVar15 = ((uint)bVar3 + (uint)bVar2) - (uint)bVar12;
                      uVar27 = iVar15 - (uint)bVar2;
                      uVar14 = -uVar27;
                      if (0 < (int)uVar27) {
                        uVar14 = uVar27;
                      }
                      uVar13 = iVar15 - (uint)bVar3;
                      uVar27 = -uVar13;
                      if (0 < (int)uVar13) {
                        uVar27 = uVar13;
                      }
                      uVar16 = iVar15 - (uint)bVar12;
                      uVar13 = -uVar16;
                      if (0 < (int)uVar16) {
                        uVar13 = uVar16;
                      }
                      if (uVar27 <= uVar13) {
                        bVar12 = bVar3;
                      }
                      if (uVar13 < uVar14) {
                        bVar2 = bVar12;
                      }
                      if (uVar27 < uVar14) {
                        bVar2 = bVar12;
                      }
                      *psVar29 = bVar2 + pbVar30[uVar23];
                      uVar23 = uVar23 + 1;
                      pbVar26 = pbVar26 + 1;
                      psVar29 = psVar29 + 1;
                    } while (uVar9 != uVar23);
                  }
                  break;
                case 5:
                  if (0 < (int)uVar9) {
                    uVar23 = 0;
                    do {
                      psVar29[uVar23] = (psVar8[uVar23 + (lVar24 - iVar15)] >> 1) + pbVar30[uVar23];
                      uVar23 = uVar23 + 1;
                    } while (uVar9 != uVar23);
                  }
                  break;
                case 6:
                  if (0 < (int)uVar9) {
                    uVar23 = 0;
                    do {
                      psVar29[uVar23] = psVar8[uVar23 + (lVar24 - iVar15)] + pbVar30[uVar23];
                      uVar23 = uVar23 + 1;
                    } while (uVar9 != uVar23);
                  }
                }
                pbVar30 = pbVar30 + (int)uVar9;
              }
              else {
                switch(bVar2) {
                case 0:
                  if (iVar7 != 0) {
                    iVar19 = iVar7;
                    do {
                      if (0 < iVar15) {
                        uVar23 = 0;
                        do {
                          psVar29[uVar23] = pbVar30[uVar23];
                          uVar23 = uVar23 + 1;
                        } while (uVar33 != uVar23);
                      }
                      psVar29[iVar15] = 0xff;
                      pbVar30 = pbVar30 + iVar15;
                      psVar29 = psVar29 + lVar28;
                      iVar19 = iVar19 + -1;
                    } while (iVar19 != 0);
                  }
                  break;
                case 1:
                  if (iVar7 != 0) {
                    psVar8 = psVar8 + lVar24 + lVar18;
                    iVar19 = iVar7;
                    do {
                      if (0 < iVar15) {
                        uVar23 = 0;
                        do {
                          psVar29[uVar23] = psVar8[uVar23] + pbVar30[uVar23];
                          uVar23 = uVar23 + 1;
                        } while (uVar33 != uVar23);
                      }
                      psVar29[iVar15] = 0xff;
                      pbVar30 = pbVar30 + iVar15;
                      psVar29 = psVar29 + lVar28;
                      psVar8 = psVar8 + lVar28;
                      iVar19 = iVar19 + -1;
                    } while (iVar19 != 0);
                  }
                  break;
                case 2:
                  if (iVar7 != 0) {
                    iVar19 = iVar7;
                    do {
                      if (0 < iVar15) {
                        uVar23 = 0;
                        do {
                          psVar29[uVar23] = psVar29[uVar23 + lVar32] + pbVar30[uVar23];
                          uVar23 = uVar23 + 1;
                        } while (uVar33 != uVar23);
                      }
                      psVar29[iVar15] = 0xff;
                      pbVar30 = pbVar30 + iVar15;
                      psVar29 = psVar29 + lVar28;
                      iVar19 = iVar19 + -1;
                    } while (iVar19 != 0);
                  }
                  break;
                case 3:
                  if (iVar7 != 0) {
                    iVar19 = iVar7;
                    do {
                      if (0 < iVar15) {
                        uVar23 = 0;
                        psVar8 = psVar29;
                        do {
                          *psVar8 = (char)((uint)psVar8[lVar18] + (uint)psVar8[lVar32] >> 1) +
                                    pbVar30[uVar23];
                          uVar23 = uVar23 + 1;
                          psVar8 = psVar8 + 1;
                        } while (uVar33 != uVar23);
                      }
                      psVar29[iVar15] = 0xff;
                      pbVar30 = pbVar30 + iVar15;
                      psVar29 = psVar29 + lVar28;
                      iVar19 = iVar19 + -1;
                    } while (iVar19 != 0);
                  }
                  break;
                case 4:
                  if (iVar7 != 0) {
                    psVar11 = psVar8 + lVar24 + lVar32;
                    psVar25 = psVar8 + lVar24 + lVar18;
                    psVar8 = psVar8 + lVar24 + (lVar18 - (ulong)uVar5);
                    iVar19 = iVar7;
                    do {
                      if (0 < iVar15) {
                        uVar23 = 0;
                        do {
                          bVar2 = psVar25[uVar23];
                          bVar3 = psVar11[uVar23];
                          bVar12 = psVar8[uVar23];
                          iVar17 = ((uint)bVar3 + (uint)bVar2) - (uint)bVar12;
                          uVar14 = iVar17 - (uint)bVar2;
                          uVar9 = -uVar14;
                          if (0 < (int)uVar14) {
                            uVar9 = uVar14;
                          }
                          uVar27 = iVar17 - (uint)bVar3;
                          uVar14 = -uVar27;
                          if (0 < (int)uVar27) {
                            uVar14 = uVar27;
                          }
                          uVar13 = iVar17 - (uint)bVar12;
                          uVar27 = -uVar13;
                          if (0 < (int)uVar13) {
                            uVar27 = uVar13;
                          }
                          if (uVar14 <= uVar27) {
                            bVar12 = bVar3;
                          }
                          if (uVar27 < uVar9) {
                            bVar2 = bVar12;
                          }
                          if (uVar14 < uVar9) {
                            bVar2 = bVar12;
                          }
                          psVar29[uVar23] = bVar2 + pbVar30[uVar23];
                          uVar23 = uVar23 + 1;
                        } while (uVar33 != uVar23);
                      }
                      psVar29[iVar15] = 0xff;
                      pbVar30 = pbVar30 + iVar15;
                      psVar29 = psVar29 + lVar28;
                      psVar11 = psVar11 + lVar28;
                      psVar25 = psVar25 + lVar28;
                      psVar8 = psVar8 + lVar28;
                      iVar19 = iVar19 + -1;
                    } while (iVar19 != 0);
                  }
                  break;
                case 5:
                  if (iVar7 != 0) {
                    psVar8 = psVar8 + lVar24 + lVar18;
                    iVar19 = iVar7;
                    do {
                      if (0 < iVar15) {
                        uVar23 = 0;
                        do {
                          psVar29[uVar23] = (psVar8[uVar23] >> 1) + pbVar30[uVar23];
                          uVar23 = uVar23 + 1;
                        } while (uVar33 != uVar23);
                      }
                      psVar29[iVar15] = 0xff;
                      pbVar30 = pbVar30 + iVar15;
                      psVar29 = psVar29 + lVar28;
                      psVar8 = psVar8 + lVar28;
                      iVar19 = iVar19 + -1;
                    } while (iVar19 != 0);
                  }
                  break;
                case 6:
                  if (iVar7 != 0) {
                    psVar8 = psVar8 + lVar24 + lVar18;
                    iVar19 = iVar7;
                    do {
                      if (0 < iVar15) {
                        uVar23 = 0;
                        do {
                          psVar29[uVar23] = psVar8[uVar23] + pbVar30[uVar23];
                          uVar23 = uVar23 + 1;
                        } while (uVar33 != uVar23);
                      }
                      psVar29[iVar15] = 0xff;
                      pbVar30 = pbVar30 + iVar15;
                      psVar29 = psVar29 + lVar28;
                      psVar8 = psVar8 + lVar28;
                      iVar19 = iVar19 + -1;
                    } while (iVar19 != 0);
                  }
                }
                bVar34 = true;
                if (depth == 0x10) {
                  if (x != 0) {
                    psVar8 = a->out + (long)iVar15 + (ulong)uVar10 + 1;
                    uVar23 = (ulong)x;
                    do {
                      *psVar8 = 0xff;
                      psVar8 = psVar8 + lVar28;
                      uVar9 = (int)uVar23 - 1;
                      uVar23 = (ulong)uVar9;
                    } while (uVar9 != 0);
                  }
                  goto LAB_00152da7;
                }
              }
              bVar34 = true;
            }
            else {
              stbi__g_failure_reason = "invalid filter";
              bVar34 = false;
            }
LAB_00152da7:
            if (!bVar34) {
              return 0;
            }
            local_c0 = local_c0 + 1;
            uVar10 = uVar10 + uVar5;
            raw = pbVar30;
          } while (local_c0 != y);
        }
        if (7 < depth) {
          if (depth != 0x10) {
            return 1;
          }
          if (uVar4 * y != 0) {
            psVar8 = a->out;
            lVar31 = 0;
            do {
              puVar1 = (ushort *)(psVar8 + lVar31 * 2);
              *puVar1 = *puVar1 << 8 | *puVar1 >> 8;
              lVar31 = lVar31 + 1;
            } while (uVar4 * y != (int)lVar31);
            return 1;
          }
          return 1;
        }
        if (y == 0) {
          return 1;
        }
        uVar21 = x - 1;
        lVar31 = uVar4 - uVar22;
        lVar18 = (ulong)uVar21 + 1;
        uVar10 = 0;
        uVar33 = 0;
        do {
          bVar2 = 1;
          if (color == 0) {
            bVar2 = ""[depth];
          }
          psVar8 = a->out;
          pbVar26 = psVar8 + uVar5 * (int)uVar33;
          pbVar30 = pbVar26 + (uVar4 - uVar22);
          uVar23 = (ulong)uVar10;
          if (depth == 4) {
            iVar7 = iVar6;
            if (1 < iVar6) {
              psVar29 = psVar8 + lVar31;
              iVar15 = iVar6;
              do {
                psVar8[uVar23] = (psVar29[uVar23] >> 4) * bVar2;
                psVar8[uVar23 + 1] = (psVar29[uVar23] & 0xf) * bVar2;
                iVar7 = iVar15 + -2;
                psVar29 = psVar29 + 1;
                psVar8 = psVar8 + 2;
                bVar34 = 3 < iVar15;
                iVar15 = iVar7;
              } while (bVar34);
              pbVar30 = psVar29 + uVar23;
              pbVar26 = psVar8 + uVar23;
            }
            if (iVar7 == 1) {
              bVar3 = *pbVar30 >> 4;
LAB_001530db:
              bVar2 = bVar3 * bVar2;
LAB_001530de:
              *pbVar26 = bVar2;
            }
          }
          else if (depth == 2) {
            iVar7 = iVar6;
            if (3 < iVar6) {
              psVar29 = psVar8 + lVar31;
              iVar15 = iVar6;
              do {
                psVar8[uVar23] = (psVar29[uVar23] >> 6) * bVar2;
                psVar8[uVar23 + 1] = (psVar29[uVar23] >> 4 & 3) * bVar2;
                psVar8[uVar23 + 2] = (psVar29[uVar23] >> 2 & 3) * bVar2;
                psVar8[uVar23 + 3] = (psVar29[uVar23] & 3) * bVar2;
                iVar7 = iVar15 + -4;
                psVar29 = psVar29 + 1;
                psVar8 = psVar8 + 4;
                bVar34 = 7 < iVar15;
                iVar15 = iVar7;
              } while (bVar34);
              pbVar30 = psVar29 + uVar23;
              pbVar26 = psVar8 + uVar23;
            }
            if (0 < iVar7) {
              *pbVar26 = (*pbVar30 >> 6) * bVar2;
              pbVar26 = pbVar26 + 1;
            }
            if (1 < iVar7) {
              *pbVar26 = (*pbVar30 >> 4 & 3) * bVar2;
              pbVar26 = pbVar26 + 1;
            }
            if (iVar7 == 3) {
              bVar3 = *pbVar30 >> 2 & 3;
              goto LAB_001530db;
            }
          }
          else if (depth == 1) {
            iVar7 = iVar6;
            if (7 < iVar6) {
              psVar29 = psVar8 + lVar31;
              iVar15 = iVar6;
              do {
                psVar8[uVar23] = (char)psVar29[uVar23] >> 7 & bVar2;
                psVar8[uVar23 + 1] = (char)(psVar29[uVar23] * '\x02') >> 7 & bVar2;
                psVar8[uVar23 + 2] = (char)(psVar29[uVar23] << 2) >> 7 & bVar2;
                psVar8[uVar23 + 3] = (char)(psVar29[uVar23] << 3) >> 7 & bVar2;
                psVar8[uVar23 + 4] = (char)(psVar29[uVar23] << 4) >> 7 & bVar2;
                psVar8[uVar23 + 5] = (char)(psVar29[uVar23] << 5) >> 7 & bVar2;
                psVar8[uVar23 + 6] = (char)(psVar29[uVar23] << 6) >> 7 & bVar2;
                bVar3 = bVar2;
                if ((psVar29[uVar23] & 1) == 0) {
                  bVar3 = 0;
                }
                psVar8[uVar23 + 7] = bVar3;
                iVar7 = iVar15 + -8;
                psVar29 = psVar29 + 1;
                psVar8 = psVar8 + 8;
                bVar34 = 0xf < iVar15;
                iVar15 = iVar7;
              } while (bVar34);
              pbVar30 = psVar29 + uVar23;
              pbVar26 = psVar8 + uVar23;
            }
            if (0 < iVar7) {
              *pbVar26 = (char)*pbVar30 >> 7 & bVar2;
              pbVar26 = pbVar26 + 1;
            }
            if (1 < iVar7) {
              *pbVar26 = (char)(*pbVar30 * '\x02') >> 7 & bVar2;
              pbVar26 = pbVar26 + 1;
            }
            if (2 < iVar7) {
              *pbVar26 = (char)(*pbVar30 << 2) >> 7 & bVar2;
              pbVar26 = pbVar26 + 1;
            }
            if (3 < iVar7) {
              *pbVar26 = (char)(*pbVar30 << 3) >> 7 & bVar2;
              pbVar26 = pbVar26 + 1;
            }
            if (4 < iVar7) {
              *pbVar26 = (char)(*pbVar30 << 4) >> 7 & bVar2;
              pbVar26 = pbVar26 + 1;
            }
            if (5 < iVar7) {
              *pbVar26 = (char)(*pbVar30 << 5) >> 7 & bVar2;
              pbVar26 = pbVar26 + 1;
            }
            if (iVar7 == 7) {
              bVar2 = (char)(*pbVar30 << 6) >> 7 & bVar2;
              goto LAB_001530de;
            }
          }
          if (a_00 != out_n) {
            psVar8 = a->out;
            if (a_00 == 1) {
              lVar28 = lVar18;
              if (-1 < (int)uVar21) {
                do {
                  psVar8[lVar28 * 2 + (uVar23 - 1)] = 0xff;
                  psVar8[lVar28 * 2 + (uVar23 - 2)] = psVar8[lVar28 + (uVar23 - 1)];
                  lVar32 = lVar28 + -1;
                  bVar34 = 0 < lVar28;
                  lVar28 = lVar32;
                } while (lVar32 != 0 && bVar34);
              }
            }
            else if (-1 < (int)uVar21) {
              psVar29 = psVar8 + (ulong)uVar21 * 3 + 2 + uVar23;
              lVar28 = lVar18;
              do {
                psVar8[lVar28 * 4 + (uVar23 - 1)] = 0xff;
                psVar8[lVar28 * 4 + (uVar23 - 2)] = *psVar29;
                psVar8[lVar28 * 4 + (uVar23 - 3)] = psVar29[-1];
                psVar8[lVar28 * 4 + (uVar23 - 4)] = psVar29[-2];
                psVar29 = psVar29 + -3;
                lVar32 = lVar28 + -1;
                bVar34 = 0 < lVar28;
                lVar28 = lVar32;
              } while (lVar32 != 0 && bVar34);
            }
          }
          uVar33 = uVar33 + 1;
          uVar10 = uVar10 + uVar5;
          if (uVar33 == y) {
            return 1;
          }
        } while( true );
      }
      stbi__g_failure_reason = "not enough pixels";
    }
  }
  return 0;
}

Assistant:

static int stbi__create_png_image_raw(stbi__png *a, stbi_uc *raw, stbi__uint32 raw_len, int out_n, stbi__uint32 x, stbi__uint32 y, int depth, int color)
{
   int bytes = (depth == 16? 2 : 1);
   stbi__context *s = a->s;
   stbi__uint32 i,j,stride = x*out_n*bytes;
   stbi__uint32 img_len, img_width_bytes;
   int k;
   int img_n = s->img_n; // copy it into a local for later

   int output_bytes = out_n*bytes;
   int filter_bytes = img_n*bytes;
   int width = x;

   STBI_ASSERT(out_n == s->img_n || out_n == s->img_n+1);
   a->out = (stbi_uc *) stbi__malloc_mad3(x, y, output_bytes, 0); // extra bytes to write off the end into
   if (!a->out) return stbi__err("outofmem", "Out of memory");

   if (!stbi__mad3sizes_valid(img_n, x, depth, 7)) return stbi__err("too large", "Corrupt PNG");
   img_width_bytes = (((img_n * x * depth) + 7) >> 3);
   img_len = (img_width_bytes + 1) * y;

   // we used to check for exact match between raw_len and img_len on non-interlaced PNGs,
   // but issue #276 reported a PNG in the wild that had extra data at the end (all zeros),
   // so just check for raw_len < img_len always.
   if (raw_len < img_len) return stbi__err("not enough pixels","Corrupt PNG");

   for (j=0; j < y; ++j) {
      stbi_uc *cur = a->out + stride*j;
      stbi_uc *prior;
      int filter = *raw++;

      if (filter > 4)
         return stbi__err("invalid filter","Corrupt PNG");

      if (depth < 8) {
         if (img_width_bytes > x) return stbi__err("invalid width","Corrupt PNG");
         cur += x*out_n - img_width_bytes; // store output to the rightmost img_len bytes, so we can decode in place
         filter_bytes = 1;
         width = img_width_bytes;
      }
      prior = cur - stride; // bugfix: need to compute this after 'cur +=' computation above

      // if first row, use special filter that doesn't sample previous row
      if (j == 0) filter = first_row_filter[filter];

      // handle first byte explicitly
      for (k=0; k < filter_bytes; ++k) {
         switch (filter) {
            case STBI__F_none       : cur[k] = raw[k]; break;
            case STBI__F_sub        : cur[k] = raw[k]; break;
            case STBI__F_up         : cur[k] = STBI__BYTECAST(raw[k] + prior[k]); break;
            case STBI__F_avg        : cur[k] = STBI__BYTECAST(raw[k] + (prior[k]>>1)); break;
            case STBI__F_paeth      : cur[k] = STBI__BYTECAST(raw[k] + stbi__paeth(0,prior[k],0)); break;
            case STBI__F_avg_first  : cur[k] = raw[k]; break;
            case STBI__F_paeth_first: cur[k] = raw[k]; break;
         }
      }

      if (depth == 8) {
         if (img_n != out_n)
            cur[img_n] = 255; // first pixel
         raw += img_n;
         cur += out_n;
         prior += out_n;
      } else if (depth == 16) {
         if (img_n != out_n) {
            cur[filter_bytes]   = 255; // first pixel top byte
            cur[filter_bytes+1] = 255; // first pixel bottom byte
         }
         raw += filter_bytes;
         cur += output_bytes;
         prior += output_bytes;
      } else {
         raw += 1;
         cur += 1;
         prior += 1;
      }

      // this is a little gross, so that we don't switch per-pixel or per-component
      if (depth < 8 || img_n == out_n) {
         int nk = (width - 1)*filter_bytes;
         #define STBI__CASE(f) \
             case f:     \
                for (k=0; k < nk; ++k)
         switch (filter) {
            // "none" filter turns into a memcpy here; make that explicit.
            case STBI__F_none:         memcpy(cur, raw, nk); break;
            STBI__CASE(STBI__F_sub)          { cur[k] = STBI__BYTECAST(raw[k] + cur[k-filter_bytes]); } break;
            STBI__CASE(STBI__F_up)           { cur[k] = STBI__BYTECAST(raw[k] + prior[k]); } break;
            STBI__CASE(STBI__F_avg)          { cur[k] = STBI__BYTECAST(raw[k] + ((prior[k] + cur[k-filter_bytes])>>1)); } break;
            STBI__CASE(STBI__F_paeth)        { cur[k] = STBI__BYTECAST(raw[k] + stbi__paeth(cur[k-filter_bytes],prior[k],prior[k-filter_bytes])); } break;
            STBI__CASE(STBI__F_avg_first)    { cur[k] = STBI__BYTECAST(raw[k] + (cur[k-filter_bytes] >> 1)); } break;
            STBI__CASE(STBI__F_paeth_first)  { cur[k] = STBI__BYTECAST(raw[k] + stbi__paeth(cur[k-filter_bytes],0,0)); } break;
         }
         #undef STBI__CASE
         raw += nk;
      } else {
         STBI_ASSERT(img_n+1 == out_n);
         #define STBI__CASE(f) \
             case f:     \
                for (i=x-1; i >= 1; --i, cur[filter_bytes]=255,raw+=filter_bytes,cur+=output_bytes,prior+=output_bytes) \
                   for (k=0; k < filter_bytes; ++k)
         switch (filter) {
            STBI__CASE(STBI__F_none)         { cur[k] = raw[k]; } break;
            STBI__CASE(STBI__F_sub)          { cur[k] = STBI__BYTECAST(raw[k] + cur[k- output_bytes]); } break;
            STBI__CASE(STBI__F_up)           { cur[k] = STBI__BYTECAST(raw[k] + prior[k]); } break;
            STBI__CASE(STBI__F_avg)          { cur[k] = STBI__BYTECAST(raw[k] + ((prior[k] + cur[k- output_bytes])>>1)); } break;
            STBI__CASE(STBI__F_paeth)        { cur[k] = STBI__BYTECAST(raw[k] + stbi__paeth(cur[k- output_bytes],prior[k],prior[k- output_bytes])); } break;
            STBI__CASE(STBI__F_avg_first)    { cur[k] = STBI__BYTECAST(raw[k] + (cur[k- output_bytes] >> 1)); } break;
            STBI__CASE(STBI__F_paeth_first)  { cur[k] = STBI__BYTECAST(raw[k] + stbi__paeth(cur[k- output_bytes],0,0)); } break;
         }
         #undef STBI__CASE

         // the loop above sets the high byte of the pixels' alpha, but for
         // 16 bit png files we also need the low byte set. we'll do that here.
         if (depth == 16) {
            cur = a->out + stride*j; // start at the beginning of the row again
            for (i=0; i < x; ++i,cur+=output_bytes) {
               cur[filter_bytes+1] = 255;
            }
         }
      }